

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O2

void __thiscall holder::holder(holder *this,string *n)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)n);
  lower_string(&this->name,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

holder(std::string n) : name{lower_string(n)}
    {
    }